

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O2

int __thiscall UdpLayer::status(UdpLayer *this,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"UdpLayer::status()");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"localaddr: ");
  operator<<(poVar1,&this->laddr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"sockfd: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->sockfd);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(out);
  return 1;
}

Assistant:

int UdpLayer::status(std::ostream &out) {
	out << "UdpLayer::status()" << std::endl;
	out << "localaddr: " << laddr << std::endl;
	out << "sockfd: " << sockfd << std::endl;
	out << std::endl;
	return 1;
}